

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  Nullable<const_char_*> failure_msg;
  char *pcVar11;
  uint *puVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 offset;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *delta;
  int v1;
  ParseContext *local_80 [2];
  MessageLite *local_70;
  uint64_t local_68;
  TcParseTableBase *local_60;
  undefined4 local_54;
  undefined1 local_50 [32];
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  uVar1 = *(ushort *)ptr;
  pMVar9 = *(MessageLite **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  offset = data.field_0 >> 0x30;
  local_70 = msg;
  local_68 = hasbits;
  local_60 = table;
  local_50._24_8_ = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(msg,offset.data);
  local_50._16_8_ = MessageLite::GetTcParseTable(pMVar9);
  local_50._8_8_ = local_50._16_8_ + 0x38;
  do {
    delta = (ParseContext *)local_50._24_8_;
    pMVar9 = AddMessage((TcParseTableBase *)local_50._16_8_,(RepeatedPtrFieldBase *)local_50._24_8_)
    ;
    local_80[0] = (ParseContext *)
                  ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
    uVar7 = ReadSize((char **)local_80);
    ctx_00 = local_80[0];
    if ((local_80[0] == (ParseContext *)0x0) || (ctx->depth_ < 1)) goto LAB_001dd5cb;
    offset.data._4_4_ = 0;
    offset.data._0_4_ = uVar7;
    delta = ctx;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)(local_50 + 4),(char *)ctx,(int)local_80[0])
    ;
    uVar4 = local_50._8_8_;
    uVar3 = local_50._4_4_;
    v1 = ctx->depth_ + -1;
    ctx->depth_ = v1;
    ctx_00 = extraout_RDX;
    if (local_80[0] == (ParseContext *)0x0) goto LAB_001dd5cb;
    while (bVar5 = ParseContext::Done(ctx,(char **)local_80), !bVar5) {
      uVar2 = *(ushort *)&(local_80[0]->super_EpsCopyInputStream).limit_end_;
      uVar8 = (uint)((TcParseTableBase *)(uVar4 + -0x38))->fast_idx_mask & (uint)uVar2;
      if ((uVar8 & 7) != 0) goto LAB_001dd673;
      uVar10 = (ulong)(uVar8 & 0xfffffff8);
      offset.data = (ulong)uVar2 ^ *(ulong *)((uint8_t *)(uVar4 + 8) + uVar10 * 2);
      local_80[0] = (ParseContext *)
                    (**(code **)((uint16_t *)uVar4 + uVar10))
                              (pMVar9,local_80[0],ctx,offset.data,
                               (TcParseTableBase *)(uVar4 + -0x38),0);
      if ((local_80[0] == (ParseContext *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_54 = uVar3;
    if ((((TcParseTableBase *)(uVar4 + -0x38))->field_0x9 & 1) == 0) {
      ptr = (char *)local_80[0];
      if (local_80[0] == (ParseContext *)0x0) {
        VerifyHasBitConsistency(pMVar9,(TcParseTableBase *)(uVar4 + -0x38));
        ptr = (char *)local_80[0];
        goto LAB_001dd5ba;
      }
LAB_001dd536:
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (v1,ctx->depth_,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x481,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_80);
      }
      bVar5 = false;
    }
    else {
      ptr = (*((TcParseTableBase *)(uVar4 + -0x38))->post_loop_handler)
                      (pMVar9,(char *)local_80[0],ctx);
LAB_001dd5ba:
      if ((ParseContext *)ptr != (ParseContext *)0x0) goto LAB_001dd536;
      bVar5 = true;
      ptr = (char *)0x0;
    }
    ctx->depth_ = ctx->depth_ + 1;
    local_50._0_4_ = local_54;
    delta = (ParseContext *)local_50;
    bVar6 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)delta);
    ctx_00 = extraout_RDX_00;
    if ((!bVar6) || (bVar5)) {
LAB_001dd5cb:
      pcVar11 = Error(local_70,(char *)delta,ctx_00,(TcFieldData)offset,local_60,local_68);
      return pcVar11;
    }
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)local_60->has_bits_offset != 0) {
        puVar12 = RefAt<unsigned_int>(local_70,(ulong)local_60->has_bits_offset);
        *puVar12 = *puVar12 | (uint)local_68;
      }
      return (char *)(ParseContext *)ptr;
    }
    uVar2 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
    offset.data._2_6_ = 0;
    offset.data._0_2_ = uVar2;
    if (uVar2 != uVar1) {
      uVar8 = (uint)local_60->fast_idx_mask & (uint)uVar2;
      if ((uVar8 & 7) == 0) {
        uVar10 = (ulong)(uVar8 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&local_60[1].has_bits_offset + uVar10))
                                    (local_70,ptr,ctx,
                                     offset.data ^
                                     *(ulong *)(&local_60[1].fast_idx_mask + uVar10 * 2),local_60,
                                     local_68);
        return pcVar11;
      }
LAB_001dd673:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}